

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O3

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenWithin
          (DiagnosticsReporter *this,
          vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  SyntaxToken *this_00;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *in_RDX;
  ulong uVar7;
  undefined8 uVar8;
  string s;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  DiagnosticDescriptor local_b8;
  string local_50;
  
  joinTokenNames_abi_cxx11_(&local_50,(DiagnosticsReporter *)validTkKinds,in_RDX);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x45a4f6);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_128 = *plVar5;
    lStack_120 = plVar3[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*plVar3;
  }
  local_130 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_188 = *puVar6;
    lStack_180 = plVar3[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar6;
    local_198 = (ulong *)*plVar3;
  }
  local_190 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_178,this_00);
  uVar7 = 0xf;
  if (local_198 != &local_188) {
    uVar7 = local_188;
  }
  if (uVar7 < local_178._M_string_length + local_190) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar8 = local_178.field_2._M_allocated_capacity;
    }
    if (local_178._M_string_length + local_190 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_198);
      goto LAB_002a71ae;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
LAB_002a71ae:
  local_b8.id_._M_dataplus._M_p = (pointer)&local_b8.id_.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b8.id_.field_2._M_allocated_capacity = *psVar1;
    local_b8.id_.field_2._8_8_ = puVar4[3];
  }
  else {
    local_b8.id_.field_2._M_allocated_capacity = *psVar1;
    local_b8.id_._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_b8.id_._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_148 = *plVar5;
    lStack_140 = plVar3[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar5;
    local_158 = (long *)*plVar3;
  }
  local_150 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar2 = &local_b8.id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,ID_of_ExpectedTokenWithin_abi_cxx11_._M_dataplus._M_p,
             ID_of_ExpectedTokenWithin_abi_cxx11_._M_dataplus._M_p +
             ID_of_ExpectedTokenWithin_abi_cxx11_._M_string_length);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"[[expected one of tokens]]","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,local_158,local_150 + (long)local_158);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_b8,local_d8,local_f8,local_118,2,1);
  diagnoseOrDelayDiagnostic(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.description_._M_dataplus._M_p != &local_b8.description_.field_2) {
    operator_delete(local_b8.description_._M_dataplus._M_p,
                    local_b8.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.title_._M_dataplus._M_p != &local_b8.title_.field_2) {
    operator_delete(local_b8.title_._M_dataplus._M_p,
                    local_b8.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.id_._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8.id_._M_dataplus._M_p,local_b8.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenWithin(const std::vector<SyntaxKind>& validTkKinds)
{
    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + ", got `"
            + parser_->peek().valueText()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedTokenWithin,
                                     "[[expected one of tokens]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}